

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::~EventLoop(EventLoop *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long in_FS_OFFSET;
  
  if (this->looping_ == true) {
    __assert_fail("!looping_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                  ,0x27,"EventLoop::~EventLoop()");
  }
  *(undefined8 *)(in_FS_OFFSET + -0x40) = 0;
  close(this->wakeupFd_);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->pendingFuntors_);
  pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
  p_Var1 = (this->wakeupChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::~vector
            (&this->activeChannels_);
  p_Var1 = (this->timer_).super___shared_ptr<TimerHeap,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->poller_).super___shared_ptr<EPoller,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

EventLoop::~EventLoop() {
    assert(!looping_);
    t_loopInThisThread = NULL;
    close(wakeupFd_);
}